

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffsparser.cpp
# Opt level: O2

USTATUS __thiscall FfsParser::parseGuidedSectionBody(FfsParser *this,UModelIndex *index)

{
  TreeModel *this_00;
  bool bVar1;
  __type _Var2;
  USTATUS UVar3;
  CBString *this_01;
  UINT8 algorithm;
  UByteArray local_110;
  UINT32 dictionarySize;
  CBString local_e8;
  CBString local_c8;
  CBString info;
  UByteArray processed;
  UByteArray baGuid;
  UByteArray efiDecompressed;
  EFI_GUID guid;
  
  bVar1 = UModelIndex::isValid(index);
  if (!bVar1) {
    return 1;
  }
  guid.Data1 = 0;
  guid.Data2 = 0;
  guid.Data3 = 0;
  guid.Data4[0] = '\0';
  guid.Data4[1] = '\0';
  guid.Data4[2] = '\0';
  guid.Data4[3] = '\0';
  guid.Data4[4] = '\0';
  guid.Data4[5] = '\0';
  guid.Data4[6] = '\0';
  guid.Data4[7] = '\0';
  bVar1 = TreeModel::hasEmptyParsingData(this->model,index);
  if (!bVar1) {
    TreeModel::parsingData(&processed,this->model,index);
    guid._0_8_ = *(undefined8 *)processed.d._M_dataplus._M_p;
    guid.Data4 = *(UINT8 (*) [8])(processed.d._M_dataplus._M_p + 8);
    std::__cxx11::string::~string((string *)&processed);
  }
  TreeModel::body(&processed,this->model,index);
  efiDecompressed.d._M_dataplus._M_p = (pointer)&efiDecompressed.d.field_2;
  efiDecompressed.d._M_string_length = 0;
  efiDecompressed.d.field_2._M_local_buf[0] = '\0';
  Bstrlib::CBString::CBString(&info);
  algorithm = '\x01';
  dictionarySize = 0;
  UByteArray::UByteArray(&baGuid,(char *)&guid,0x10);
  _Var2 = std::operator==(&baGuid.d,&EFI_GUIDED_SECTION_TIANO.d);
  if (_Var2) {
    TreeModel::body(&local_110,this->model,index);
    UVar3 = decompress(&local_110,'\x01',&algorithm,&dictionarySize,&processed,&efiDecompressed);
    std::__cxx11::string::~string((string *)&local_110);
    if (UVar3 != 0) {
      usprintf(&local_e8,"%s: decompression failed with error ","parseGuidedSectionBody");
      errorCodeToUString(&local_c8,UVar3);
      Bstrlib::CBString::operator+((CBString *)&local_110,&local_e8,&local_c8);
      msg(this,(CBString *)&local_110,index);
      goto LAB_0011c9f7;
    }
    bVar1 = true;
    if (algorithm == '\x04') {
      UVar3 = parseSections(this,&processed,index,false);
      if (UVar3 == 0) {
        algorithm = '\x03';
      }
      else {
        UVar3 = parseSections(this,&efiDecompressed,index,false);
        if (UVar3 == 0) {
          algorithm = '\x02';
          std::__cxx11::string::_M_assign((string *)&processed);
        }
        else {
          usprintf((CBString *)&local_110,
                   "%s: can\'t guess the correct decompression algorithm, both preparse steps are failed"
                   ,"parseGuidedSectionBody");
          msg(this,(CBString *)&local_110,index);
          Bstrlib::CBString::~CBString((CBString *)&local_110);
          bVar1 = false;
        }
      }
    }
    Bstrlib::CBString::CBString(&local_e8,"\nCompression algorithm: ");
    compressionTypeToUString(&local_c8,algorithm);
    Bstrlib::CBString::operator+((CBString *)&local_110,&local_e8,&local_c8);
    Bstrlib::CBString::operator+=(&info,(CBString *)&local_110);
    Bstrlib::CBString::~CBString((CBString *)&local_110);
    Bstrlib::CBString::~CBString(&local_c8);
    Bstrlib::CBString::~CBString(&local_e8);
    usprintf((CBString *)&local_110,"\nDecompressed size: %Xh (%u)",
             (ulong)(uint)processed.d._M_string_length);
    Bstrlib::CBString::operator+=(&info,(CBString *)&local_110);
LAB_0011cd7c:
    Bstrlib::CBString::~CBString((CBString *)&local_110);
LAB_0011cd86:
    TreeModel::addInfo(this->model,index,&info,true);
    local_e8._vptr_CBString = (_func_int **)0x0;
    local_e8.super_tagbstring.mlen = 0;
    local_e8.super_tagbstring.slen = 0;
    local_e8.super_tagbstring.data._0_4_ = dictionarySize;
    this_00 = this->model;
    UByteArray::UByteArray(&local_110,(char *)&local_e8,0x14);
    TreeModel::setParsingData(this_00,index,&local_110);
    std::__cxx11::string::~string((string *)&local_110);
    if (algorithm != '\x01') {
      TreeModel::setUncompressedData(this->model,index,&processed);
      TreeModel::setCompressed(this->model,index,true);
    }
    if (bVar1) {
      UVar3 = parseSections(this,&processed,index,true);
      goto LAB_0011ce53;
    }
    usprintf((CBString *)&local_110,"%s: GUID defined section can not be processed",
             "parseGuidedSectionBody");
    msg(this,(CBString *)&local_110,index);
    this_01 = (CBString *)&local_110;
  }
  else {
    _Var2 = std::operator==(&baGuid.d,&EFI_GUIDED_SECTION_LZMA.d);
    if (((_Var2) || (_Var2 = std::operator==(&baGuid.d,&EFI_GUIDED_SECTION_LZMA_HP.d), _Var2)) ||
       (_Var2 = std::operator==(&baGuid.d,&EFI_GUIDED_SECTION_LZMA_MS.d), _Var2)) {
      TreeModel::body(&local_110,this->model,index);
      UVar3 = decompress(&local_110,'\x02',&algorithm,&dictionarySize,&processed,&efiDecompressed);
      std::__cxx11::string::~string((string *)&local_110);
      if (UVar3 == 0) {
        if (algorithm == '\x05') {
          Bstrlib::CBString::CBString((CBString *)&local_110,"\nCompression algorithm: LZMA");
          Bstrlib::CBString::operator+=(&info,(CBString *)&local_110);
          Bstrlib::CBString::~CBString((CBString *)&local_110);
          usprintf((CBString *)&local_110,"\nDecompressed size: %Xh (%u)",
                   (ulong)(uint)processed.d._M_string_length);
          Bstrlib::CBString::operator+=(&info,(CBString *)&local_110);
          Bstrlib::CBString::~CBString((CBString *)&local_110);
          usprintf((CBString *)&local_110,"\nLZMA dictionary size: %Xh",(ulong)dictionarySize);
          Bstrlib::CBString::operator+=(&info,(CBString *)&local_110);
          goto LAB_0011cb2a;
        }
        Bstrlib::CBString::CBString((CBString *)&local_110,"\nCompression algorithm: unknown");
        Bstrlib::CBString::operator+=(&info,(CBString *)&local_110);
LAB_0011cb5c:
        Bstrlib::CBString::~CBString((CBString *)&local_110);
        bVar1 = false;
        goto LAB_0011cd86;
      }
      usprintf(&local_e8,"%s: decompression failed with error ","parseGuidedSectionBody");
      errorCodeToUString(&local_c8,UVar3);
      Bstrlib::CBString::operator+((CBString *)&local_110,&local_e8,&local_c8);
      msg(this,(CBString *)&local_110,index);
    }
    else {
      _Var2 = std::operator==(&baGuid.d,&EFI_GUIDED_SECTION_LZMAF86.d);
      if (_Var2) {
        TreeModel::body(&local_110,this->model,index);
        UVar3 = decompress(&local_110,0x86,&algorithm,&dictionarySize,&processed,&efiDecompressed);
        std::__cxx11::string::~string((string *)&local_110);
        if (UVar3 == 0) {
          if (algorithm != '\a') {
            Bstrlib::CBString::CBString((CBString *)&local_110,"\nCompression algorithm: unknown");
            Bstrlib::CBString::operator+=(&info,(CBString *)&local_110);
            goto LAB_0011cb5c;
          }
          Bstrlib::CBString::CBString((CBString *)&local_110,"\nCompression algorithm: LZMAF86");
          Bstrlib::CBString::operator+=(&info,(CBString *)&local_110);
          Bstrlib::CBString::~CBString((CBString *)&local_110);
          usprintf((CBString *)&local_110,"\nDecompressed size: %Xh (%u)",
                   (ulong)(uint)processed.d._M_string_length);
          Bstrlib::CBString::operator+=(&info,(CBString *)&local_110);
          Bstrlib::CBString::~CBString((CBString *)&local_110);
          usprintf((CBString *)&local_110,"\nLZMA dictionary size: %Xh",(ulong)dictionarySize);
          Bstrlib::CBString::operator+=(&info,(CBString *)&local_110);
LAB_0011cb2a:
          Bstrlib::CBString::~CBString((CBString *)&local_110);
          bVar1 = true;
          goto LAB_0011cd86;
        }
        usprintf(&local_e8,"%s: decompression failed with error ","parseGuidedSectionBody");
        errorCodeToUString(&local_c8,UVar3);
        Bstrlib::CBString::operator+((CBString *)&local_110,&local_e8,&local_c8);
        msg(this,(CBString *)&local_110,index);
      }
      else {
        _Var2 = std::operator==(&baGuid.d,&EFI_GUIDED_SECTION_GZIP.d);
        if (_Var2) {
          TreeModel::body(&local_110,this->model,index);
          UVar3 = gzipDecompress(&local_110,&processed);
          std::__cxx11::string::~string((string *)&local_110);
          if (UVar3 == 0) {
            algorithm = '\b';
            Bstrlib::CBString::CBString((CBString *)&local_110,"\nCompression algorithm: GZip");
            Bstrlib::CBString::operator+=(&info,(CBString *)&local_110);
            Bstrlib::CBString::~CBString((CBString *)&local_110);
            usprintf((CBString *)&local_110,"\nDecompressed size: %Xh (%u)",
                     (ulong)(uint)processed.d._M_string_length);
            Bstrlib::CBString::operator+=(&info,(CBString *)&local_110);
            goto LAB_0011cb2a;
          }
          usprintf(&local_e8,"%s: decompression failed with error ","parseGuidedSectionBody");
          errorCodeToUString(&local_c8,UVar3);
          Bstrlib::CBString::operator+((CBString *)&local_110,&local_e8,&local_c8);
          msg(this,(CBString *)&local_110,index);
        }
        else {
          _Var2 = std::operator==(&baGuid.d,&EFI_GUIDED_SECTION_ZLIB_AMD.d);
          bVar1 = true;
          if (!_Var2) goto LAB_0011cd86;
          TreeModel::body(&local_110,this->model,index);
          UVar3 = zlibDecompress(&local_110,&processed);
          std::__cxx11::string::~string((string *)&local_110);
          if (UVar3 == 0) {
            algorithm = '\t';
            Bstrlib::CBString::CBString((CBString *)&local_110,"\nCompression algorithm: Zlib");
            Bstrlib::CBString::operator+=(&info,(CBString *)&local_110);
            Bstrlib::CBString::~CBString((CBString *)&local_110);
            usprintf((CBString *)&local_110,"\nDecompressed size: %Xh (%u)",
                     (ulong)(uint)processed.d._M_string_length);
            Bstrlib::CBString::operator+=(&info,(CBString *)&local_110);
            bVar1 = true;
            goto LAB_0011cd7c;
          }
          usprintf(&local_e8,"%s: decompression failed with error ","parseGuidedSectionBody");
          errorCodeToUString(&local_c8,UVar3);
          Bstrlib::CBString::operator+((CBString *)&local_110,&local_e8,&local_c8);
          msg(this,(CBString *)&local_110,index);
        }
      }
    }
LAB_0011c9f7:
    Bstrlib::CBString::~CBString((CBString *)&local_110);
    Bstrlib::CBString::~CBString(&local_c8);
    this_01 = &local_e8;
  }
  Bstrlib::CBString::~CBString(this_01);
  UVar3 = 0;
LAB_0011ce53:
  std::__cxx11::string::~string((string *)&baGuid);
  Bstrlib::CBString::~CBString(&info);
  std::__cxx11::string::~string((string *)&efiDecompressed);
  std::__cxx11::string::~string((string *)&processed);
  return UVar3;
}

Assistant:

USTATUS FfsParser::parseGuidedSectionBody(const UModelIndex & index)
{
    // Sanity check
    if (!index.isValid())
        return U_INVALID_PARAMETER;
    
    // Obtain required information from parsing data
    EFI_GUID guid = { 0, 0, 0, {0, 0, 0, 0, 0, 0, 0, 0 }};
    if (model->hasEmptyParsingData(index) == false) {
        UByteArray data = model->parsingData(index);
        const GUIDED_SECTION_PARSING_DATA* pdata = (const GUIDED_SECTION_PARSING_DATA*)data.constData();
        guid = readUnaligned(pdata).guid;
    }
    
    // Check if section requires processing
    UByteArray processed = model->body(index);
    UByteArray efiDecompressed;
    UString info;
    bool parseCurrentSection = true;
    UINT8 algorithm = COMPRESSION_ALGORITHM_NONE;
    UINT32 dictionarySize = 0;
    UByteArray baGuid = UByteArray((const char*)&guid, sizeof(EFI_GUID));
    // Tiano compressed section
    if (baGuid == EFI_GUIDED_SECTION_TIANO) {
        USTATUS result = decompress(model->body(index), EFI_STANDARD_COMPRESSION, algorithm, dictionarySize, processed, efiDecompressed);
        if (result) {
            msg(usprintf("%s: decompression failed with error ", __FUNCTION__) + errorCodeToUString(result), index);
            return U_SUCCESS;
        }
        
        // Check for undecided compression algorithm, this is a special case
        if (algorithm == COMPRESSION_ALGORITHM_UNDECIDED) {
            // Try preparse of sections decompressed with Tiano algorithm
            if (U_SUCCESS == parseSections(processed, index, false)) {
                algorithm = COMPRESSION_ALGORITHM_TIANO;
            }
            // Try preparse of sections decompressed with EFI 1.1 algorithm
            else if (U_SUCCESS == parseSections(efiDecompressed, index, false)) {
                algorithm = COMPRESSION_ALGORITHM_EFI11;
                processed = efiDecompressed;
            }
            else {
                msg(usprintf("%s: can't guess the correct decompression algorithm, both preparse steps are failed", __FUNCTION__), index);
                parseCurrentSection = false;
            }
        }
        
        info += UString("\nCompression algorithm: ") + compressionTypeToUString(algorithm);
        info += usprintf("\nDecompressed size: %Xh (%u)", (UINT32)processed.size(), (UINT32)processed.size());
    }
    // LZMA compressed section
    else if (baGuid == EFI_GUIDED_SECTION_LZMA
             || baGuid == EFI_GUIDED_SECTION_LZMA_HP
             || baGuid == EFI_GUIDED_SECTION_LZMA_MS) {
        USTATUS result = decompress(model->body(index), EFI_CUSTOMIZED_COMPRESSION, algorithm, dictionarySize, processed, efiDecompressed);
        if (result) {
            msg(usprintf("%s: decompression failed with error ", __FUNCTION__) + errorCodeToUString(result), index);
            return U_SUCCESS;
        }
        
        if (algorithm == COMPRESSION_ALGORITHM_LZMA) {
            info += UString("\nCompression algorithm: LZMA");
            info += usprintf("\nDecompressed size: %Xh (%u)", (UINT32)processed.size(), (UINT32)processed.size());
            info += usprintf("\nLZMA dictionary size: %Xh", dictionarySize);
        }
        else {
            info += UString("\nCompression algorithm: unknown");
            parseCurrentSection = false;
        }
    }
    // LZMAF86 compressed section
    else if (baGuid == EFI_GUIDED_SECTION_LZMAF86) {
        USTATUS result = decompress(model->body(index), EFI_CUSTOMIZED_COMPRESSION_LZMAF86, algorithm, dictionarySize, processed, efiDecompressed);
        if (result) {
            msg(usprintf("%s: decompression failed with error ", __FUNCTION__) + errorCodeToUString(result), index);
            return U_SUCCESS;
        }
        
        if (algorithm == COMPRESSION_ALGORITHM_LZMAF86) {
            info += UString("\nCompression algorithm: LZMAF86");
            info += usprintf("\nDecompressed size: %Xh (%u)", (UINT32)processed.size(), (UINT32)processed.size());
            info += usprintf("\nLZMA dictionary size: %Xh", dictionarySize);
        }
        else {
            info += UString("\nCompression algorithm: unknown");
            parseCurrentSection = false;
        }
    }
    // GZip compressed section
    else if (baGuid == EFI_GUIDED_SECTION_GZIP) {
        USTATUS result = gzipDecompress(model->body(index), processed);
        if (result) {
            msg(usprintf("%s: decompression failed with error ", __FUNCTION__) + errorCodeToUString(result), index);
            return U_SUCCESS;
        }

        algorithm = COMPRESSION_ALGORITHM_GZIP;
        info += UString("\nCompression algorithm: GZip");
        info += usprintf("\nDecompressed size: %Xh (%u)", (UINT32)processed.size(), (UINT32)processed.size());
    }
    // Zlib compressed section
    else if (baGuid == EFI_GUIDED_SECTION_ZLIB_AMD) {
        USTATUS result = zlibDecompress(model->body(index), processed);
        if (result) {
            msg(usprintf("%s: decompression failed with error ", __FUNCTION__) + errorCodeToUString(result), index);
            return U_SUCCESS;
        }

        algorithm = COMPRESSION_ALGORITHM_ZLIB;
        info += UString("\nCompression algorithm: Zlib");
        info += usprintf("\nDecompressed size: %Xh (%u)", (UINT32)processed.size(), (UINT32)processed.size());
    }
    
    // Add info
    model->addInfo(index, info);
    
    // Set parsing data
    GUIDED_SECTION_PARSING_DATA pdata = {};
    pdata.dictionarySize = dictionarySize;
    model->setParsingData(index, UByteArray((const char*)&pdata, sizeof(pdata)));
    
    // Set compression data
    if (algorithm != COMPRESSION_ALGORITHM_NONE) {
        model->setUncompressedData(index, processed);
        model->setCompressed(index, true);
    }
    
    if (!parseCurrentSection) {
        msg(usprintf("%s: GUID defined section can not be processed", __FUNCTION__), index);
        return U_SUCCESS;
    }
    
    return parseSections(processed, index, true);
}